

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O0

void pdqsort_detail::
     sort3<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__0>
               (__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                a,__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                  b,__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                    c,anon_class_16_2_a9e7a8bd comp)

{
  anon_class_16_2_a9e7a8bd comp_00;
  anon_class_16_2_a9e7a8bd comp_01;
  anon_class_16_2_a9e7a8bd comp_02;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  in_RCX;
  double **in_RSI;
  HighsTableauSeparator *in_RDI;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  in_R8;
  double **in_stack_ffffffffffffff88;
  HighsTableauSeparator *in_stack_ffffffffffffff90;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  in_stack_ffffffffffffff98;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  in_stack_ffffffffffffffa0;
  
  comp_00.this = in_stack_ffffffffffffff90;
  comp_00.edgeWt = in_stack_ffffffffffffff88;
  sort2<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__0>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,comp_00);
  comp_01.this = in_stack_ffffffffffffff90;
  comp_01.edgeWt = in_stack_ffffffffffffff88;
  sort2<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__0>
            (in_R8,in_RCX,comp_01);
  comp_02.this = in_RDI;
  comp_02.edgeWt = in_RSI;
  sort2<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__0>
            (in_R8,in_RCX,comp_02);
  return;
}

Assistant:

inline void sort3(Iter a, Iter b, Iter c, Compare comp) {
        sort2(a, b, comp);
        sort2(b, c, comp);
        sort2(a, b, comp);
    }